

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O3

ssize_t __thiscall
QNetworkAccessFileBackend::read
          (QNetworkAccessFileBackend *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  Operation OVar2;
  int iVar3;
  long lVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QString local_a8;
  QUrl local_90;
  QString local_88;
  QString local_70;
  type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
  if (OVar2 == GetOperation) {
    lVar4 = QIODevice::read((char *)(this + 0x10),CONCAT44(in_register_00000034,__fd));
    if (lVar4 < 1) {
      iVar3 = QFileDevice::error();
      if (iVar3 == 0) {
        QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
      }
      else {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QCoreApplication::translate
                  ((char *)&local_70,"QNetworkAccessFileBackend","Read error reading from %1: %2",0)
        ;
        QNetworkAccessBackend::url((QNetworkAccessBackend *)&local_90);
        QUrl::toString(&local_88,(QNetworkAccessBackend *)&local_90,0);
        QIODevice::errorString();
        QString::arg<QString,QString>(&local_58,&local_70,&local_88,&local_a8);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        QUrl::~QUrl(&local_90);
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
          }
        }
        QNetworkAccessBackend::error((QNetworkAccessBackend *)this,ProtocolFailure,&local_58);
        QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar4 = -1;
      }
    }
    else {
      cVar1 = QFileDevice::isSequential();
      if (cVar1 == '\0') {
        cVar1 = QFileDevice::atEnd();
        if (cVar1 != '\0') {
          QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
        }
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + lVar4;
    }
  }
  else {
    lVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar4;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkAccessFileBackend::read(char *data, qint64 maxlen)
{
    if (operation() != QNetworkAccessManager::GetOperation)
        return 0;
    qint64 actuallyRead = file.read(data, maxlen);
    if (actuallyRead <= 0) {
        // EOF or error
        if (file.error() != QFile::NoError) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Read error reading from %1: %2")
                            .arg(url().toString(), file.errorString());
            error(QNetworkReply::ProtocolFailure, msg);

            finished();
            return -1;
        }

        finished();
        return actuallyRead;
    }
    if (!file.isSequential() && file.atEnd())
        finished();
    totalBytes += actuallyRead;
    return actuallyRead;
}